

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettywriter.h
# Opt level: O1

bool __thiscall
rapidjson::
PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::EndArray(PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
           *this,SizeType memberCount)

{
  char *pcVar1;
  
  pcVar1 = (this->
           super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
           ).level_stack_.stackTop_;
  (this->
  super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ).level_stack_.stackTop_ = pcVar1 + -0x10;
  if ((*(long *)(pcVar1 + -0x10) != 0) &&
     ((this->formatOptions_ & kFormatSingleLineArray) == kFormatDefault)) {
    std::ostream::put((char)((this->
                             super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                             ).os_)->stream_);
    WriteIndent(this);
  }
  std::ostream::put((char)((this->
                           super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                           ).os_)->stream_);
  if ((this->
      super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
      ).level_stack_.stackTop_ ==
      (this->
      super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
      ).level_stack_.stack_) {
    std::ostream::flush();
  }
  if ((this->
      super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
      ).level_stack_.stackTop_ ==
      (this->
      super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
      ).level_stack_.stack_) {
    std::ostream::flush();
  }
  return true;
}

Assistant:

bool EndArray(SizeType memberCount = 0) {
        (void)memberCount;
        RAPIDJSON_ASSERT(Base::level_stack_.GetSize() >= sizeof(typename Base::Level));
        RAPIDJSON_ASSERT(Base::level_stack_.template Top<typename Base::Level>()->inArray);
        bool empty = Base::level_stack_.template Pop<typename Base::Level>(1)->valueCount == 0;

        if (!empty && !(formatOptions_ & kFormatSingleLineArray)) {
            Base::os_->Put('\n');
            WriteIndent();
        }
        bool ret = Base::EndValue(Base::WriteEndArray());
        (void)ret;
        RAPIDJSON_ASSERT(ret == true);
        if (Base::level_stack_.Empty()) // end of json text
            Base::Flush();
        return true;
    }